

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::gles3::Functional::VertexIDCase::iterate(VertexIDCase *this)

{
  float *pfVar1;
  TestLog *pTVar2;
  pointer pVVar3;
  RenderContext *pRVar4;
  Vec4 *pVVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  last;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  last_00;
  undefined1 auVar17 [16];
  bool bVar18;
  int iVar19;
  uint uVar20;
  deUint32 dVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 extraout_var;
  RenderTarget *pRVar24;
  unsigned_short uVar25;
  long lVar26;
  short sVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  VertexIDCase *pVVar31;
  pointer pcVar32;
  int iVar35;
  undefined1 auVar33 [16];
  int iVar36;
  undefined1 auVar34 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  int iVar85;
  int iVar92;
  undefined1 auVar86 [16];
  int iVar93;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  ScopedLogSection logSection;
  Surface refImg;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> mappedPos;
  ScopedLogSection logSection_1;
  Surface testImg;
  Random rnd;
  string local_100;
  TextureFormat local_e0;
  uint local_d8;
  uint local_d4;
  undefined1 local_d0 [40];
  Surface local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  long local_80;
  ScopedLogSection local_78;
  Surface local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  deRandom local_40;
  
  iVar19 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar28 = CONCAT44(extraout_var,iVar19);
  pRVar24 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar19 = pRVar24->m_width;
  pRVar24 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar35 = pRVar24->m_height;
  iVar93 = this->m_viewportW;
  iVar36 = this->m_viewportH;
  uVar20 = ((uint)this->m_iterNdx >> 0x10 ^ this->m_iterNdx ^ 0x3d) * 9;
  uVar20 = (uVar20 >> 4 ^ uVar20) * 0x27d4eb2d;
  deRandom_init(&local_40,uVar20 >> 0xf ^ uVar20 ^ 0xcf23ab1);
  tcu::Surface::Surface(&local_a8,iVar93,iVar36);
  tcu::Surface::Surface(&local_70,iVar93,iVar36);
  dVar21 = deRandom_getUint32(&local_40);
  local_d4 = dVar21 % ((iVar19 - iVar93) + 1U);
  dVar21 = deRandom_getUint32(&local_40);
  local_d8 = dVar21 % ((iVar35 - iVar36) + 1U);
  uVar22 = (**(code **)(lVar28 + 0x780))((this->m_program->m_program).m_program,"a_position");
  uVar23 = (**(code **)(lVar28 + 0xb48))((this->m_program->m_program).m_program,"u_colors[0]");
  local_58 = (ShaderProgram *)0x0;
  uStack_50 = 0x3f80000000000000;
  (**(code **)(lVar28 + 0x1a00))(local_d4,local_d8,iVar93,iVar36);
  (**(code **)(lVar28 + 0x1680))((this->m_program->m_program).m_program);
  (**(code **)(lVar28 + 0x40))(0x8892,this->m_positionBuffer);
  (**(code **)(lVar28 + 0x610))(uVar22);
  (**(code **)(lVar28 + 0x19f0))(uVar22,4,0x1406,0,0,0);
  (**(code **)(lVar28 + 0x15a8))
            (uVar23,(ulong)((long)(this->m_colors).
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_colors).
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
  (**(code **)(lVar28 + 0x1c0))
            ((ulong)local_58 & 0xffffffff,local_58._4_4_,uStack_50 & 0xffffffff,uStack_50._4_4_);
  (**(code **)(lVar28 + 0x188))(0x4000);
  local_100._M_dataplus._M_p = (pointer)0x300000008;
  pcVar32 = (pointer)local_a8.m_pixels.m_cap;
  if ((pointer)local_a8.m_pixels.m_cap != (pointer)0x0) {
    pcVar32 = (pointer)local_a8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_d0,(TextureFormat *)&local_100,local_a8.m_width,
             local_a8.m_height,1,pcVar32);
  tcu::clear((PixelBufferAccess *)local_d0,(Vec4 *)&local_58);
  iVar19 = this->m_iterNdx;
  if (iVar19 == 2) {
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_d0._0_8_ = (long)local_d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"Iter2","");
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"glDrawElements(), indices in buffer","");
    tcu::ScopedLogSection::ScopedLogSection(&local_78,pTVar2,(string *)local_d0,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if (local_d0._0_8_ != (long)local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_100,
               (long)(this->m_positions).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_positions).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)local_d0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_90,
               (long)(this->m_positions).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_positions).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)local_d0);
    auVar17 = _DAT_019ec5b0;
    last_00._M_current._4_4_ = local_100._M_string_length._4_4_;
    last_00._M_current._0_4_ = (int)local_100._M_string_length;
    uVar20 = (uint)((ulong)((long)last_00._M_current - (long)local_100._M_dataplus._M_p) >> 1);
    if (0 < (int)uVar20) {
      lVar26 = (ulong)(uVar20 & 0x7fffffff) - 1;
      auVar50._8_4_ = (int)lVar26;
      auVar50._0_8_ = lVar26;
      auVar50._12_4_ = (int)((ulong)lVar26 >> 0x20);
      uVar29 = 0;
      auVar50 = auVar50 ^ _DAT_019ec5b0;
      auVar45 = _DAT_01a918f0;
      auVar94 = _DAT_01a91900;
      auVar101 = _DAT_01a1c6c0;
      auVar49 = _DAT_019f34d0;
      do {
        auVar74 = auVar49 ^ auVar17;
        iVar19 = auVar50._0_4_;
        iVar85 = -(uint)(iVar19 < auVar74._0_4_);
        iVar35 = auVar50._4_4_;
        auVar64._4_4_ = -(uint)(iVar35 < auVar74._4_4_);
        iVar93 = auVar50._8_4_;
        iVar92 = -(uint)(iVar93 < auVar74._8_4_);
        iVar36 = auVar50._12_4_;
        auVar64._12_4_ = -(uint)(iVar36 < auVar74._12_4_);
        auVar82._4_4_ = iVar85;
        auVar82._0_4_ = iVar85;
        auVar82._8_4_ = iVar92;
        auVar82._12_4_ = iVar92;
        auVar99 = pshuflw(in_XMM11,auVar82,0xe8);
        auVar66._4_4_ = -(uint)(auVar74._4_4_ == iVar35);
        auVar66._12_4_ = -(uint)(auVar74._12_4_ == iVar36);
        auVar66._0_4_ = auVar66._4_4_;
        auVar66._8_4_ = auVar66._12_4_;
        auVar102 = pshuflw(in_XMM12,auVar66,0xe8);
        auVar64._0_4_ = auVar64._4_4_;
        auVar64._8_4_ = auVar64._12_4_;
        auVar100 = pshuflw(auVar99,auVar64,0xe8);
        auVar74._8_4_ = 0xffffffff;
        auVar74._0_8_ = 0xffffffffffffffff;
        auVar74._12_4_ = 0xffffffff;
        auVar74 = (auVar100 | auVar102 & auVar99) ^ auVar74;
        auVar74 = packssdw(auVar74,auVar74);
        uVar25 = (unsigned_short)uVar29;
        if ((auVar74 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(unsigned_short *)((long)local_100._M_dataplus._M_p + uVar29 * 2) = uVar25;
        }
        auVar64 = auVar66 & auVar82 | auVar64;
        auVar74 = packssdw(auVar64,auVar64);
        auVar100._8_4_ = 0xffffffff;
        auVar100._0_8_ = 0xffffffffffffffff;
        auVar100._12_4_ = 0xffffffff;
        auVar74 = packssdw(auVar74 ^ auVar100,auVar74 ^ auVar100);
        if ((auVar74._0_4_ >> 0x10 & 1) != 0) {
          ((unsigned_short *)((long)local_100._M_dataplus._M_p + 2))[uVar29] = uVar25 + 1;
        }
        auVar74 = auVar101 ^ auVar17;
        iVar85 = -(uint)(iVar19 < auVar74._0_4_);
        auVar90._4_4_ = -(uint)(iVar35 < auVar74._4_4_);
        iVar92 = -(uint)(iVar93 < auVar74._8_4_);
        auVar90._12_4_ = -(uint)(iVar36 < auVar74._12_4_);
        auVar65._4_4_ = iVar85;
        auVar65._0_4_ = iVar85;
        auVar65._8_4_ = iVar92;
        auVar65._12_4_ = iVar92;
        auVar81._4_4_ = -(uint)(auVar74._4_4_ == iVar35);
        auVar81._12_4_ = -(uint)(auVar74._12_4_ == iVar36);
        auVar81._0_4_ = auVar81._4_4_;
        auVar81._8_4_ = auVar81._12_4_;
        auVar90._0_4_ = auVar90._4_4_;
        auVar90._8_4_ = auVar90._12_4_;
        auVar74 = auVar81 & auVar65 | auVar90;
        auVar74 = packssdw(auVar74,auVar74);
        auVar14._8_4_ = 0xffffffff;
        auVar14._0_8_ = 0xffffffffffffffff;
        auVar14._12_4_ = 0xffffffff;
        auVar74 = packssdw(auVar74 ^ auVar14,auVar74 ^ auVar14);
        if ((auVar74 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          ((unsigned_short *)((long)local_100._M_dataplus._M_p + 4))[uVar29] = uVar25 + 2;
        }
        auVar66 = pshufhw(auVar65,auVar65,0x84);
        auVar82 = pshufhw(auVar81,auVar81,0x84);
        auVar64 = pshufhw(auVar66,auVar90,0x84);
        auVar67._8_4_ = 0xffffffff;
        auVar67._0_8_ = 0xffffffffffffffff;
        auVar67._12_4_ = 0xffffffff;
        auVar67 = (auVar64 | auVar82 & auVar66) ^ auVar67;
        auVar66 = packssdw(auVar67,auVar67);
        if ((auVar66 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          ((unsigned_short *)((long)local_100._M_dataplus._M_p + 6))[uVar29] = uVar25 + 3;
        }
        auVar66 = auVar94 ^ auVar17;
        iVar85 = -(uint)(iVar19 < auVar66._0_4_);
        auVar69._4_4_ = -(uint)(iVar35 < auVar66._4_4_);
        iVar92 = -(uint)(iVar93 < auVar66._8_4_);
        auVar69._12_4_ = -(uint)(iVar36 < auVar66._12_4_);
        auVar83._4_4_ = iVar85;
        auVar83._0_4_ = iVar85;
        auVar83._8_4_ = iVar92;
        auVar83._12_4_ = iVar92;
        auVar74 = pshuflw(auVar74,auVar83,0xe8);
        auVar68._4_4_ = -(uint)(auVar66._4_4_ == iVar35);
        auVar68._12_4_ = -(uint)(auVar66._12_4_ == iVar36);
        auVar68._0_4_ = auVar68._4_4_;
        auVar68._8_4_ = auVar68._12_4_;
        in_XMM12 = pshuflw(auVar102 & auVar99,auVar68,0xe8);
        in_XMM12 = in_XMM12 & auVar74;
        auVar69._0_4_ = auVar69._4_4_;
        auVar69._8_4_ = auVar69._12_4_;
        auVar74 = pshuflw(auVar74,auVar69,0xe8);
        auVar99._8_4_ = 0xffffffff;
        auVar99._0_8_ = 0xffffffffffffffff;
        auVar99._12_4_ = 0xffffffff;
        auVar99 = (auVar74 | in_XMM12) ^ auVar99;
        auVar74 = packssdw(auVar99,auVar99);
        if ((auVar74 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          ((unsigned_short *)((long)local_100._M_dataplus._M_p + 8))[uVar29] = uVar25 + 4;
        }
        auVar69 = auVar68 & auVar83 | auVar69;
        auVar74 = packssdw(auVar69,auVar69);
        auVar102._8_4_ = 0xffffffff;
        auVar102._0_8_ = 0xffffffffffffffff;
        auVar102._12_4_ = 0xffffffff;
        auVar74 = packssdw(auVar74 ^ auVar102,auVar74 ^ auVar102);
        if ((auVar74 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          ((unsigned_short *)((long)local_100._M_dataplus._M_p + 10))[uVar29] = uVar25 + 5;
        }
        auVar74 = auVar45 ^ auVar17;
        iVar19 = -(uint)(iVar19 < auVar74._0_4_);
        auVar91._4_4_ = -(uint)(iVar35 < auVar74._4_4_);
        iVar93 = -(uint)(iVar93 < auVar74._8_4_);
        auVar91._12_4_ = -(uint)(iVar36 < auVar74._12_4_);
        auVar70._4_4_ = iVar19;
        auVar70._0_4_ = iVar19;
        auVar70._8_4_ = iVar93;
        auVar70._12_4_ = iVar93;
        auVar84._4_4_ = -(uint)(auVar74._4_4_ == iVar35);
        auVar84._12_4_ = -(uint)(auVar74._12_4_ == iVar36);
        auVar84._0_4_ = auVar84._4_4_;
        auVar84._8_4_ = auVar84._12_4_;
        auVar91._0_4_ = auVar91._4_4_;
        auVar91._8_4_ = auVar91._12_4_;
        auVar74 = auVar84 & auVar70 | auVar91;
        auVar74 = packssdw(auVar74,auVar74);
        auVar15._8_4_ = 0xffffffff;
        auVar15._0_8_ = 0xffffffffffffffff;
        auVar15._12_4_ = 0xffffffff;
        in_XMM11 = packssdw(auVar74 ^ auVar15,auVar74 ^ auVar15);
        if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          ((unsigned_short *)((long)local_100._M_dataplus._M_p + 0xc))[uVar29] = uVar25 + 6;
        }
        auVar74 = pshufhw(auVar70,auVar70,0x84);
        auVar64 = pshufhw(auVar84,auVar84,0x84);
        auVar66 = pshufhw(auVar74,auVar91,0x84);
        auVar71._8_4_ = 0xffffffff;
        auVar71._0_8_ = 0xffffffffffffffff;
        auVar71._12_4_ = 0xffffffff;
        auVar71 = (auVar66 | auVar64 & auVar74) ^ auVar71;
        auVar74 = packssdw(auVar71,auVar71);
        if ((auVar74 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          ((unsigned_short *)((long)local_100._M_dataplus._M_p + 0xe))[uVar29] = uVar25 + 7;
        }
        uVar29 = uVar29 + 8;
        lVar26 = auVar49._8_8_;
        auVar49._0_8_ = auVar49._0_8_ + 8;
        auVar49._8_8_ = lVar26 + 8;
        lVar26 = auVar101._8_8_;
        auVar101._0_8_ = auVar101._0_8_ + 8;
        auVar101._8_8_ = lVar26 + 8;
        lVar26 = auVar94._8_8_;
        auVar94._0_8_ = auVar94._0_8_ + 8;
        auVar94._8_8_ = lVar26 + 8;
        lVar26 = auVar45._8_8_;
        auVar45._0_8_ = auVar45._0_8_ + 8;
        auVar45._8_8_ = lVar26 + 8;
      } while ((uVar20 + 7 & 0xfffffff8) != uVar29);
    }
    de::Random::
    shuffle<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
              ((Random *)&local_40,
               (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                )local_100._M_dataplus._M_p,last_00);
    if (0 < (int)((ulong)(CONCAT44(local_100._M_string_length._4_4_,(int)local_100._M_string_length)
                         - (long)local_100._M_dataplus._M_p) >> 1)) {
      lVar26 = 0;
      lVar30 = 0;
      do {
        pfVar1 = ((this->m_positions).
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar26 * 2;
        uVar16 = *(undefined8 *)(pfVar1 + 2);
        pVVar5 = (Vec4 *)(local_90._M_allocated_capacity +
                         (ulong)*(ushort *)(local_100._M_dataplus._M_p + lVar26) * 0x10);
        *(undefined8 *)pVVar5->m_data = *(undefined8 *)pfVar1;
        *(undefined8 *)(pVVar5->m_data + 2) = uVar16;
        lVar30 = lVar30 + 1;
        lVar26 = lVar26 + 2;
      } while (lVar30 < (int)((ulong)(CONCAT44(local_100._M_string_length._4_4_,
                                               (int)local_100._M_string_length) -
                                     (long)local_100._M_dataplus._M_p) >> 1));
    }
    (**(code **)(lVar28 + 0x40))(0x8893,this->m_elementBuffer);
    (**(code **)(lVar28 + 0x150))
              (0x8893,(long)((int)local_100._M_string_length - (int)local_100._M_dataplus._M_p) &
                      0xfffffffffffffffe,local_100._M_dataplus._M_p,0x88e8);
    (**(code **)(lVar28 + 0x150))
              (0x8892,(long)(*(int *)&(this->m_positions).
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                            *(int *)&(this->m_positions).
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0
               ,local_90._M_allocated_capacity,0x88e8);
    (**(code **)(lVar28 + 0x568))
              (4,(ulong)(CONCAT44(local_100._M_string_length._4_4_,(int)local_100._M_string_length)
                        - (long)local_100._M_dataplus._M_p) >> 1,0x1403,0);
    pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
    local_e0.order = RGBA;
    local_e0.type = UNORM_INT8;
    if ((Context *)local_70.m_pixels.m_cap != (Context *)0x0) {
      local_70.m_pixels.m_cap = (size_t)local_70.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_d0,&local_e0,local_70.m_width,local_70.m_height,1,
               (void *)local_70.m_pixels.m_cap);
    glu::readPixels(pRVar4,local_d4,local_d8,(PixelBufferAccess *)local_d0);
    dVar21 = (**(code **)(lVar28 + 0x800))();
    glu::checkError(dVar21,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                    ,0x423);
    local_e0.order = RGBA;
    local_e0.type = UNORM_INT8;
    pcVar32 = (pointer)local_a8.m_pixels.m_cap;
    if ((pointer)local_a8.m_pixels.m_cap != (pointer)0x0) {
      pcVar32 = (pointer)local_a8.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_d0,&local_e0,local_a8.m_width,local_a8.m_height,1,pcVar32)
    ;
    tcu::clear((PixelBufferAccess *)local_d0,(Vec4 *)&local_58);
    local_e0.order = RGBA;
    local_e0.type = UNORM_INT8;
    if ((pointer)local_a8.m_pixels.m_cap != (pointer)0x0) {
      local_a8.m_pixels.m_cap = (size_t)local_a8.m_pixels.m_ptr;
    }
    pVVar31 = (VertexIDCase *)local_d0;
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)pVVar31,&local_e0,local_a8.m_width,local_a8.m_height,1,
               (void *)local_a8.m_pixels.m_cap);
    renderReference(pVVar31,(PixelBufferAccess *)local_d0,
                    (int)((ulong)(CONCAT44(local_100._M_string_length._4_4_,
                                           (int)local_100._M_string_length) -
                                 (long)local_100._M_dataplus._M_p) >> 1),
                    (deUint16 *)local_100._M_dataplus._M_p,(Vec4 *)local_90._M_allocated_capacity,
                    (this->m_colors).
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    if ((Vec4 *)local_90._M_allocated_capacity != (Vec4 *)0x0) {
      operator_delete((void *)local_90._M_allocated_capacity,local_80 - local_90._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_100._M_dataplus._M_p,
                      local_100.field_2._M_allocated_capacity - (long)local_100._M_dataplus._M_p);
    }
    tcu::TestLog::endSection(local_78.m_log);
  }
  else if (iVar19 == 1) {
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_d0._0_8_ = (long)local_d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"Iter1","");
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"glDrawElements(), indices in client-side array","");
    tcu::ScopedLogSection::ScopedLogSection(&local_78,pTVar2,(string *)local_d0,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if (local_d0._0_8_ != (long)local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_100,
               (long)(this->m_positions).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_positions).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)local_d0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_90,
               (long)(this->m_positions).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_positions).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)local_d0);
    auVar17 = _DAT_019ec5b0;
    last._M_current._4_4_ = local_100._M_string_length._4_4_;
    last._M_current._0_4_ = (int)local_100._M_string_length;
    uVar20 = (uint)((ulong)((long)last._M_current - (long)local_100._M_dataplus._M_p) >> 1);
    if (0 < (int)uVar20) {
      lVar26 = (ulong)(uVar20 & 0x7fffffff) - 1;
      auVar34._8_4_ = (int)lVar26;
      auVar34._0_8_ = lVar26;
      auVar34._12_4_ = (int)((ulong)lVar26 >> 0x20);
      uVar29 = 0;
      auVar34 = auVar34 ^ _DAT_019ec5b0;
      auVar38 = _DAT_01a918f0;
      auVar40 = _DAT_01a91900;
      auVar42 = _DAT_01a1c6c0;
      auVar44 = _DAT_019f34d0;
      do {
        auVar45 = auVar44 ^ auVar17;
        iVar19 = auVar34._0_4_;
        iVar85 = -(uint)(iVar19 < auVar45._0_4_);
        iVar35 = auVar34._4_4_;
        auVar57._4_4_ = -(uint)(iVar35 < auVar45._4_4_);
        iVar93 = auVar34._8_4_;
        iVar92 = -(uint)(iVar93 < auVar45._8_4_);
        iVar36 = auVar34._12_4_;
        auVar57._12_4_ = -(uint)(iVar36 < auVar45._12_4_);
        auVar77._4_4_ = iVar85;
        auVar77._0_4_ = iVar85;
        auVar77._8_4_ = iVar92;
        auVar77._12_4_ = iVar92;
        auVar94 = pshuflw(in_XMM11,auVar77,0xe8);
        auVar56._4_4_ = -(uint)(auVar45._4_4_ == iVar35);
        auVar56._12_4_ = -(uint)(auVar45._12_4_ == iVar36);
        auVar56._0_4_ = auVar56._4_4_;
        auVar56._8_4_ = auVar56._12_4_;
        auVar101 = pshuflw(in_XMM12,auVar56,0xe8);
        auVar57._0_4_ = auVar57._4_4_;
        auVar57._8_4_ = auVar57._12_4_;
        auVar45 = pshuflw(auVar94,auVar57,0xe8);
        auVar97._8_4_ = 0xffffffff;
        auVar97._0_8_ = 0xffffffffffffffff;
        auVar97._12_4_ = 0xffffffff;
        auVar97 = (auVar45 | auVar101 & auVar94) ^ auVar97;
        auVar45 = packssdw(auVar97,auVar97);
        uVar25 = (unsigned_short)uVar29;
        if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(unsigned_short *)((long)local_100._M_dataplus._M_p + uVar29 * 2) = uVar25;
        }
        auVar57 = auVar56 & auVar77 | auVar57;
        auVar45 = packssdw(auVar57,auVar57);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar45 = packssdw(auVar45 ^ auVar10,auVar45 ^ auVar10);
        if ((auVar45._0_4_ >> 0x10 & 1) != 0) {
          ((unsigned_short *)((long)local_100._M_dataplus._M_p + 2))[uVar29] = uVar25 + 1;
        }
        auVar45 = auVar42 ^ auVar17;
        iVar85 = -(uint)(iVar19 < auVar45._0_4_);
        auVar88._4_4_ = -(uint)(iVar35 < auVar45._4_4_);
        iVar92 = -(uint)(iVar93 < auVar45._8_4_);
        auVar88._12_4_ = -(uint)(iVar36 < auVar45._12_4_);
        auVar58._4_4_ = iVar85;
        auVar58._0_4_ = iVar85;
        auVar58._8_4_ = iVar92;
        auVar58._12_4_ = iVar92;
        auVar78._4_4_ = -(uint)(auVar45._4_4_ == iVar35);
        auVar78._12_4_ = -(uint)(auVar45._12_4_ == iVar36);
        auVar78._0_4_ = auVar78._4_4_;
        auVar78._8_4_ = auVar78._12_4_;
        auVar88._0_4_ = auVar88._4_4_;
        auVar88._8_4_ = auVar88._12_4_;
        auVar45 = auVar78 & auVar58 | auVar88;
        auVar45 = packssdw(auVar45,auVar45);
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0xffffffffffffffff;
        auVar11._12_4_ = 0xffffffff;
        auVar45 = packssdw(auVar45 ^ auVar11,auVar45 ^ auVar11);
        if ((auVar45 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          ((unsigned_short *)((long)local_100._M_dataplus._M_p + 4))[uVar29] = uVar25 + 2;
        }
        auVar49 = pshufhw(auVar58,auVar58,0x84);
        auVar74 = pshufhw(auVar78,auVar78,0x84);
        auVar50 = pshufhw(auVar49,auVar88,0x84);
        auVar59._8_4_ = 0xffffffff;
        auVar59._0_8_ = 0xffffffffffffffff;
        auVar59._12_4_ = 0xffffffff;
        auVar59 = (auVar50 | auVar74 & auVar49) ^ auVar59;
        auVar49 = packssdw(auVar59,auVar59);
        if ((auVar49 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          ((unsigned_short *)((long)local_100._M_dataplus._M_p + 6))[uVar29] = uVar25 + 3;
        }
        auVar49 = auVar40 ^ auVar17;
        iVar85 = -(uint)(iVar19 < auVar49._0_4_);
        auVar61._4_4_ = -(uint)(iVar35 < auVar49._4_4_);
        iVar92 = -(uint)(iVar93 < auVar49._8_4_);
        auVar61._12_4_ = -(uint)(iVar36 < auVar49._12_4_);
        auVar79._4_4_ = iVar85;
        auVar79._0_4_ = iVar85;
        auVar79._8_4_ = iVar92;
        auVar79._12_4_ = iVar92;
        auVar45 = pshuflw(auVar45,auVar79,0xe8);
        auVar60._4_4_ = -(uint)(auVar49._4_4_ == iVar35);
        auVar60._12_4_ = -(uint)(auVar49._12_4_ == iVar36);
        auVar60._0_4_ = auVar60._4_4_;
        auVar60._8_4_ = auVar60._12_4_;
        in_XMM12 = pshuflw(auVar101 & auVar94,auVar60,0xe8);
        in_XMM12 = in_XMM12 & auVar45;
        auVar61._0_4_ = auVar61._4_4_;
        auVar61._8_4_ = auVar61._12_4_;
        auVar45 = pshuflw(auVar45,auVar61,0xe8);
        auVar98._8_4_ = 0xffffffff;
        auVar98._0_8_ = 0xffffffffffffffff;
        auVar98._12_4_ = 0xffffffff;
        auVar98 = (auVar45 | in_XMM12) ^ auVar98;
        auVar45 = packssdw(auVar98,auVar98);
        if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          ((unsigned_short *)((long)local_100._M_dataplus._M_p + 8))[uVar29] = uVar25 + 4;
        }
        auVar61 = auVar60 & auVar79 | auVar61;
        auVar45 = packssdw(auVar61,auVar61);
        auVar12._8_4_ = 0xffffffff;
        auVar12._0_8_ = 0xffffffffffffffff;
        auVar12._12_4_ = 0xffffffff;
        auVar45 = packssdw(auVar45 ^ auVar12,auVar45 ^ auVar12);
        if ((auVar45 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          ((unsigned_short *)((long)local_100._M_dataplus._M_p + 10))[uVar29] = uVar25 + 5;
        }
        auVar45 = auVar38 ^ auVar17;
        iVar19 = -(uint)(iVar19 < auVar45._0_4_);
        auVar89._4_4_ = -(uint)(iVar35 < auVar45._4_4_);
        iVar93 = -(uint)(iVar93 < auVar45._8_4_);
        auVar89._12_4_ = -(uint)(iVar36 < auVar45._12_4_);
        auVar62._4_4_ = iVar19;
        auVar62._0_4_ = iVar19;
        auVar62._8_4_ = iVar93;
        auVar62._12_4_ = iVar93;
        auVar80._4_4_ = -(uint)(auVar45._4_4_ == iVar35);
        auVar80._12_4_ = -(uint)(auVar45._12_4_ == iVar36);
        auVar80._0_4_ = auVar80._4_4_;
        auVar80._8_4_ = auVar80._12_4_;
        auVar89._0_4_ = auVar89._4_4_;
        auVar89._8_4_ = auVar89._12_4_;
        auVar45 = auVar80 & auVar62 | auVar89;
        auVar45 = packssdw(auVar45,auVar45);
        auVar13._8_4_ = 0xffffffff;
        auVar13._0_8_ = 0xffffffffffffffff;
        auVar13._12_4_ = 0xffffffff;
        in_XMM11 = packssdw(auVar45 ^ auVar13,auVar45 ^ auVar13);
        if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          ((unsigned_short *)((long)local_100._M_dataplus._M_p + 0xc))[uVar29] = uVar25 + 6;
        }
        auVar45 = pshufhw(auVar62,auVar62,0x84);
        auVar101 = pshufhw(auVar80,auVar80,0x84);
        auVar94 = pshufhw(auVar45,auVar89,0x84);
        auVar63._8_4_ = 0xffffffff;
        auVar63._0_8_ = 0xffffffffffffffff;
        auVar63._12_4_ = 0xffffffff;
        auVar63 = (auVar94 | auVar101 & auVar45) ^ auVar63;
        auVar45 = packssdw(auVar63,auVar63);
        if ((auVar45 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          ((unsigned_short *)((long)local_100._M_dataplus._M_p + 0xe))[uVar29] = uVar25 + 7;
        }
        uVar29 = uVar29 + 8;
        lVar26 = auVar44._8_8_;
        auVar44._0_8_ = auVar44._0_8_ + 8;
        auVar44._8_8_ = lVar26 + 8;
        lVar26 = auVar42._8_8_;
        auVar42._0_8_ = auVar42._0_8_ + 8;
        auVar42._8_8_ = lVar26 + 8;
        lVar26 = auVar40._8_8_;
        auVar40._0_8_ = auVar40._0_8_ + 8;
        auVar40._8_8_ = lVar26 + 8;
        lVar26 = auVar38._8_8_;
        auVar38._0_8_ = auVar38._0_8_ + 8;
        auVar38._8_8_ = lVar26 + 8;
      } while ((uVar20 + 7 & 0xfffffff8) != uVar29);
    }
    de::Random::
    shuffle<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
              ((Random *)&local_40,
               (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                )local_100._M_dataplus._M_p,last);
    if (0 < (int)((ulong)(CONCAT44(local_100._M_string_length._4_4_,(int)local_100._M_string_length)
                         - (long)local_100._M_dataplus._M_p) >> 1)) {
      lVar26 = 0;
      lVar30 = 0;
      do {
        pfVar1 = ((this->m_positions).
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar26 * 2;
        uVar16 = *(undefined8 *)(pfVar1 + 2);
        pVVar5 = (Vec4 *)(local_90._M_allocated_capacity +
                         (ulong)*(ushort *)(local_100._M_dataplus._M_p + lVar26) * 0x10);
        *(undefined8 *)pVVar5->m_data = *(undefined8 *)pfVar1;
        *(undefined8 *)(pVVar5->m_data + 2) = uVar16;
        lVar30 = lVar30 + 1;
        lVar26 = lVar26 + 2;
      } while (lVar30 < (int)((ulong)(CONCAT44(local_100._M_string_length._4_4_,
                                               (int)local_100._M_string_length) -
                                     (long)local_100._M_dataplus._M_p) >> 1));
    }
    (**(code **)(lVar28 + 0x150))
              (0x8892,(long)(*(int *)&(this->m_positions).
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                            *(int *)&(this->m_positions).
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0
               ,local_90._M_allocated_capacity,0x88e8);
    (**(code **)(lVar28 + 0x568))
              (4,(ulong)(CONCAT44(local_100._M_string_length._4_4_,(int)local_100._M_string_length)
                        - (long)local_100._M_dataplus._M_p) >> 1,0x1403);
    pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
    local_e0.order = RGBA;
    local_e0.type = UNORM_INT8;
    if ((Context *)local_70.m_pixels.m_cap != (Context *)0x0) {
      local_70.m_pixels.m_cap = (size_t)local_70.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_d0,&local_e0,local_70.m_width,local_70.m_height,1,
               (void *)local_70.m_pixels.m_cap);
    glu::readPixels(pRVar4,local_d4,local_d8,(PixelBufferAccess *)local_d0);
    dVar21 = (**(code **)(lVar28 + 0x800))();
    glu::checkError(dVar21,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                    ,0x409);
    local_e0.order = RGBA;
    local_e0.type = UNORM_INT8;
    if ((pointer)local_a8.m_pixels.m_cap != (pointer)0x0) {
      local_a8.m_pixels.m_cap = (size_t)local_a8.m_pixels.m_ptr;
    }
    pVVar31 = (VertexIDCase *)local_d0;
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)pVVar31,&local_e0,local_a8.m_width,local_a8.m_height,1,
               (void *)local_a8.m_pixels.m_cap);
    renderReference(pVVar31,(PixelBufferAccess *)local_d0,
                    (int)((ulong)(CONCAT44(local_100._M_string_length._4_4_,
                                           (int)local_100._M_string_length) -
                                 (long)local_100._M_dataplus._M_p) >> 1),
                    (deUint16 *)local_100._M_dataplus._M_p,(Vec4 *)local_90._M_allocated_capacity,
                    (this->m_colors).
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    if ((Vec4 *)local_90._M_allocated_capacity != (Vec4 *)0x0) {
      operator_delete((void *)local_90._M_allocated_capacity,local_80 - local_90._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_100._M_dataplus._M_p,
                      local_100.field_2._M_allocated_capacity - (long)local_100._M_dataplus._M_p);
    }
    tcu::TestLog::endSection(local_78.m_log);
  }
  else if (iVar19 == 0) {
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_d0._0_8_ = (long)local_d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"Iter0","");
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"glDrawArrays()","");
    tcu::ScopedLogSection::ScopedLogSection
              ((ScopedLogSection *)&local_e0,pTVar2,(string *)local_d0,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if (local_d0._0_8_ != (long)local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_100,
               (long)(this->m_positions).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_positions).
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)local_d0);
    pVVar3 = (this->m_positions).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (**(code **)(lVar28 + 0x150))
              (0x8892,(long)(*(int *)&(this->m_positions).
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (int)pVVar3) &
                      0xfffffffffffffff0,pVVar3,0x88e8);
    (**(code **)(lVar28 + 0x538))
              (4,0,(ulong)((long)(this->m_positions).
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_positions).
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4);
    pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
    local_90._M_allocated_capacity = 0x300000008;
    if ((Context *)local_70.m_pixels.m_cap != (Context *)0x0) {
      local_70.m_pixels.m_cap = (size_t)local_70.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_d0,(TextureFormat *)&local_90._M_allocated_capacity,
               local_70.m_width,local_70.m_height,1,(void *)local_70.m_pixels.m_cap);
    glu::readPixels(pRVar4,local_d4,local_d8,(PixelBufferAccess *)local_d0);
    dVar21 = (**(code **)(lVar28 + 0x800))();
    glu::checkError(dVar21,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                    ,0x3ee);
    auVar17 = _DAT_019ec5b0;
    uVar20 = (uint)((ulong)(CONCAT44(local_100._M_string_length._4_4_,
                                     (int)local_100._M_string_length) -
                           (long)local_100._M_dataplus._M_p) >> 1);
    if (0 < (int)uVar20) {
      lVar28 = (ulong)(uVar20 & 0x7fffffff) - 1;
      auVar33._8_4_ = (int)lVar28;
      auVar33._0_8_ = lVar28;
      auVar33._12_4_ = (int)((ulong)lVar28 >> 0x20);
      uVar29 = 0;
      auVar33 = auVar33 ^ _DAT_019ec5b0;
      auVar37 = _DAT_01a918f0;
      auVar39 = _DAT_01a91900;
      auVar41 = _DAT_01a1c6c0;
      auVar43 = _DAT_019f34d0;
      do {
        auVar45 = auVar43 ^ auVar17;
        iVar19 = auVar33._0_4_;
        iVar85 = -(uint)(iVar19 < auVar45._0_4_);
        iVar35 = auVar33._4_4_;
        auVar47._4_4_ = -(uint)(iVar35 < auVar45._4_4_);
        iVar93 = auVar33._8_4_;
        iVar92 = -(uint)(iVar93 < auVar45._8_4_);
        iVar36 = auVar33._12_4_;
        auVar47._12_4_ = -(uint)(iVar36 < auVar45._12_4_);
        auVar72._4_4_ = iVar85;
        auVar72._0_4_ = iVar85;
        auVar72._8_4_ = iVar92;
        auVar72._12_4_ = iVar92;
        auVar94 = pshuflw(in_XMM11,auVar72,0xe8);
        auVar46._4_4_ = -(uint)(auVar45._4_4_ == iVar35);
        auVar46._12_4_ = -(uint)(auVar45._12_4_ == iVar36);
        auVar46._0_4_ = auVar46._4_4_;
        auVar46._8_4_ = auVar46._12_4_;
        auVar101 = pshuflw(in_XMM12,auVar46,0xe8);
        auVar47._0_4_ = auVar47._4_4_;
        auVar47._8_4_ = auVar47._12_4_;
        auVar45 = pshuflw(auVar94,auVar47,0xe8);
        auVar95._8_4_ = 0xffffffff;
        auVar95._0_8_ = 0xffffffffffffffff;
        auVar95._12_4_ = 0xffffffff;
        auVar95 = (auVar45 | auVar101 & auVar94) ^ auVar95;
        auVar45 = packssdw(auVar95,auVar95);
        sVar27 = (short)uVar29;
        if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(short *)(local_100._M_dataplus._M_p + uVar29 * 2) = sVar27;
        }
        auVar47 = auVar46 & auVar72 | auVar47;
        auVar45 = packssdw(auVar47,auVar47);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar45 = packssdw(auVar45 ^ auVar6,auVar45 ^ auVar6);
        if ((auVar45._0_4_ >> 0x10 & 1) != 0) {
          *(short *)(local_100._M_dataplus._M_p + uVar29 * 2 + 2) = sVar27 + 1;
        }
        auVar45 = auVar41 ^ auVar17;
        iVar85 = -(uint)(iVar19 < auVar45._0_4_);
        auVar86._4_4_ = -(uint)(iVar35 < auVar45._4_4_);
        iVar92 = -(uint)(iVar93 < auVar45._8_4_);
        auVar86._12_4_ = -(uint)(iVar36 < auVar45._12_4_);
        auVar48._4_4_ = iVar85;
        auVar48._0_4_ = iVar85;
        auVar48._8_4_ = iVar92;
        auVar48._12_4_ = iVar92;
        auVar73._4_4_ = -(uint)(auVar45._4_4_ == iVar35);
        auVar73._12_4_ = -(uint)(auVar45._12_4_ == iVar36);
        auVar73._0_4_ = auVar73._4_4_;
        auVar73._8_4_ = auVar73._12_4_;
        auVar86._0_4_ = auVar86._4_4_;
        auVar86._8_4_ = auVar86._12_4_;
        auVar45 = auVar73 & auVar48 | auVar86;
        auVar45 = packssdw(auVar45,auVar45);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar45 = packssdw(auVar45 ^ auVar7,auVar45 ^ auVar7);
        if ((auVar45 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(short *)(local_100._M_dataplus._M_p + uVar29 * 2 + 4) = sVar27 + 2;
        }
        auVar49 = pshufhw(auVar48,auVar48,0x84);
        auVar74 = pshufhw(auVar73,auVar73,0x84);
        auVar50 = pshufhw(auVar49,auVar86,0x84);
        auVar51._8_4_ = 0xffffffff;
        auVar51._0_8_ = 0xffffffffffffffff;
        auVar51._12_4_ = 0xffffffff;
        auVar51 = (auVar50 | auVar74 & auVar49) ^ auVar51;
        auVar49 = packssdw(auVar51,auVar51);
        if ((auVar49 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(short *)(local_100._M_dataplus._M_p + uVar29 * 2 + 6) = sVar27 + 3;
        }
        auVar49 = auVar39 ^ auVar17;
        iVar85 = -(uint)(iVar19 < auVar49._0_4_);
        auVar53._4_4_ = -(uint)(iVar35 < auVar49._4_4_);
        iVar92 = -(uint)(iVar93 < auVar49._8_4_);
        auVar53._12_4_ = -(uint)(iVar36 < auVar49._12_4_);
        auVar75._4_4_ = iVar85;
        auVar75._0_4_ = iVar85;
        auVar75._8_4_ = iVar92;
        auVar75._12_4_ = iVar92;
        auVar45 = pshuflw(auVar45,auVar75,0xe8);
        auVar52._4_4_ = -(uint)(auVar49._4_4_ == iVar35);
        auVar52._12_4_ = -(uint)(auVar49._12_4_ == iVar36);
        auVar52._0_4_ = auVar52._4_4_;
        auVar52._8_4_ = auVar52._12_4_;
        in_XMM12 = pshuflw(auVar101 & auVar94,auVar52,0xe8);
        in_XMM12 = in_XMM12 & auVar45;
        auVar53._0_4_ = auVar53._4_4_;
        auVar53._8_4_ = auVar53._12_4_;
        auVar45 = pshuflw(auVar45,auVar53,0xe8);
        auVar96._8_4_ = 0xffffffff;
        auVar96._0_8_ = 0xffffffffffffffff;
        auVar96._12_4_ = 0xffffffff;
        auVar96 = (auVar45 | in_XMM12) ^ auVar96;
        auVar45 = packssdw(auVar96,auVar96);
        if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(short *)(local_100._M_dataplus._M_p + uVar29 * 2 + 8) = sVar27 + 4;
        }
        auVar53 = auVar52 & auVar75 | auVar53;
        auVar45 = packssdw(auVar53,auVar53);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar45 = packssdw(auVar45 ^ auVar8,auVar45 ^ auVar8);
        if ((auVar45 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(short *)(local_100._M_dataplus._M_p + uVar29 * 2 + 10) = sVar27 + 5;
        }
        auVar45 = auVar37 ^ auVar17;
        iVar19 = -(uint)(iVar19 < auVar45._0_4_);
        auVar87._4_4_ = -(uint)(iVar35 < auVar45._4_4_);
        iVar93 = -(uint)(iVar93 < auVar45._8_4_);
        auVar87._12_4_ = -(uint)(iVar36 < auVar45._12_4_);
        auVar54._4_4_ = iVar19;
        auVar54._0_4_ = iVar19;
        auVar54._8_4_ = iVar93;
        auVar54._12_4_ = iVar93;
        auVar76._4_4_ = -(uint)(auVar45._4_4_ == iVar35);
        auVar76._12_4_ = -(uint)(auVar45._12_4_ == iVar36);
        auVar76._0_4_ = auVar76._4_4_;
        auVar76._8_4_ = auVar76._12_4_;
        auVar87._0_4_ = auVar87._4_4_;
        auVar87._8_4_ = auVar87._12_4_;
        auVar45 = auVar76 & auVar54 | auVar87;
        auVar45 = packssdw(auVar45,auVar45);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        in_XMM11 = packssdw(auVar45 ^ auVar9,auVar45 ^ auVar9);
        if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(short *)(local_100._M_dataplus._M_p + uVar29 * 2 + 0xc) = sVar27 + 6;
        }
        auVar45 = pshufhw(auVar54,auVar54,0x84);
        auVar101 = pshufhw(auVar76,auVar76,0x84);
        auVar94 = pshufhw(auVar45,auVar87,0x84);
        auVar55._8_4_ = 0xffffffff;
        auVar55._0_8_ = 0xffffffffffffffff;
        auVar55._12_4_ = 0xffffffff;
        auVar55 = (auVar94 | auVar101 & auVar45) ^ auVar55;
        auVar45 = packssdw(auVar55,auVar55);
        if ((auVar45 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(short *)(local_100._M_dataplus._M_p + uVar29 * 2 + 0xe) = sVar27 + 7;
        }
        uVar29 = uVar29 + 8;
        lVar28 = auVar43._8_8_;
        auVar43._0_8_ = auVar43._0_8_ + 8;
        auVar43._8_8_ = lVar28 + 8;
        lVar28 = auVar41._8_8_;
        auVar41._0_8_ = auVar41._0_8_ + 8;
        auVar41._8_8_ = lVar28 + 8;
        lVar28 = auVar39._8_8_;
        auVar39._0_8_ = auVar39._0_8_ + 8;
        auVar39._8_8_ = lVar28 + 8;
        lVar28 = auVar37._8_8_;
        auVar37._0_8_ = auVar37._0_8_ + 8;
        auVar37._8_8_ = lVar28 + 8;
      } while ((uVar20 + 7 & 0xfffffff8) != uVar29);
    }
    local_90._M_allocated_capacity = 0x300000008;
    if ((pointer)local_a8.m_pixels.m_cap != (pointer)0x0) {
      local_a8.m_pixels.m_cap = (size_t)local_a8.m_pixels.m_ptr;
    }
    pVVar31 = (VertexIDCase *)local_d0;
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)pVVar31,(TextureFormat *)&local_90._M_allocated_capacity,
               local_a8.m_width,local_a8.m_height,1,(void *)local_a8.m_pixels.m_cap);
    pVVar5 = (this->m_positions).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    renderReference(pVVar31,(PixelBufferAccess *)local_d0,
                    (int)((ulong)((long)(this->m_positions).
                                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5)
                         >> 4),(deUint16 *)local_100._M_dataplus._M_p,pVVar5,
                    (this->m_colors).
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_100._M_dataplus._M_p,
                      local_100.field_2._M_allocated_capacity - (long)local_100._M_dataplus._M_p);
    }
    tcu::TestLog::endSection((TestLog *)local_e0);
  }
  bVar18 = tcu::fuzzyCompare(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
                             ,"Result","Image comparison result",&local_a8,&local_70,0.02,
                             COMPARE_LOG_RESULT);
  if (!bVar18) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  iVar19 = this->m_iterNdx + 1;
  this->m_iterNdx = iVar19;
  tcu::Surface::~Surface(&local_70);
  tcu::Surface::~Surface(&local_a8);
  return (IterateResult)(iVar19 < 3);
}

Assistant:

VertexIDCase::IterateResult VertexIDCase::iterate (void)
{
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	const int				width		= m_context.getRenderTarget().getWidth();
	const int				height		= m_context.getRenderTarget().getHeight();
	const int				viewportW	= m_viewportW;
	const int				viewportH	= m_viewportH;

	const float				threshold	= 0.02f;

	de::Random				rnd			(0xcf23ab1 ^ deInt32Hash(m_iterNdx));
	tcu::Surface			refImg		(viewportW, viewportH);
	tcu::Surface			testImg		(viewportW, viewportH);

	const int				viewportX	= rnd.getInt(0, width-viewportW);
	const int				viewportY	= rnd.getInt(0, height-viewportH);

	const int				posLoc		= gl.getAttribLocation(m_program->getProgram(), "a_position");
	const int				colorsLoc	= gl.getUniformLocation(m_program->getProgram(), "u_colors[0]");
	const tcu::Vec4			clearColor	(0.0f, 0.0f, 0.0f, 1.0f);

	// Setup common state.
	gl.viewport					(viewportX, viewportY, viewportW, viewportH);
	gl.useProgram				(m_program->getProgram());
	gl.bindBuffer				(GL_ARRAY_BUFFER, m_positionBuffer);
	gl.enableVertexAttribArray	(posLoc);
	gl.vertexAttribPointer		(posLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	gl.uniform4fv				(colorsLoc, (int)m_colors.size(), (const float*)&m_colors[0]);

	// Clear render target to black.
	gl.clearColor	(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
	gl.clear		(GL_COLOR_BUFFER_BIT);

	tcu::clear(refImg.getAccess(), clearColor);

	if (m_iterNdx == 0)
	{
		tcu::ScopedLogSection	logSection	(m_testCtx.getLog(), "Iter0", "glDrawArrays()");
		vector<deUint16>		indices		(m_positions.size());

		gl.bufferData(GL_ARRAY_BUFFER, (int)(m_positions.size()*sizeof(tcu::Vec4)), &m_positions[0], GL_DYNAMIC_DRAW);
		gl.drawArrays(GL_TRIANGLES, 0, (int)m_positions.size());

		glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, testImg.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		// Reference indices
		for (int ndx = 0; ndx < (int)indices.size(); ndx++)
			indices[ndx] = (deUint16)ndx;

		renderReference(refImg.getAccess(), (int)m_positions.size(), &indices[0], &m_positions[0], &m_colors[0]);
	}
	else if (m_iterNdx == 1)
	{
		tcu::ScopedLogSection	logSection	(m_testCtx.getLog(), "Iter1", "glDrawElements(), indices in client-side array");
		vector<deUint16>		indices		(m_positions.size());
		vector<tcu::Vec4>		mappedPos	(m_positions.size());

		// Compute initial indices and suffle
		for (int ndx = 0; ndx < (int)indices.size(); ndx++)
			indices[ndx] = (deUint16)ndx;
		rnd.shuffle(indices.begin(), indices.end());

		// Use indices to re-map positions.
		for (int ndx = 0; ndx < (int)indices.size(); ndx++)
			mappedPos[indices[ndx]] = m_positions[ndx];

		gl.bufferData(GL_ARRAY_BUFFER, (int)(m_positions.size()*sizeof(tcu::Vec4)), &mappedPos[0], GL_DYNAMIC_DRAW);
		gl.drawElements(GL_TRIANGLES, (int)indices.size(), GL_UNSIGNED_SHORT, &indices[0]);

		glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, testImg.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		renderReference(refImg.getAccess(), (int)indices.size(), &indices[0], &mappedPos[0], &m_colors[0]);
	}
	else if (m_iterNdx == 2)
	{
		tcu::ScopedLogSection	logSection	(m_testCtx.getLog(), "Iter2", "glDrawElements(), indices in buffer");
		vector<deUint16>		indices		(m_positions.size());
		vector<tcu::Vec4>		mappedPos	(m_positions.size());

		// Compute initial indices and suffle
		for (int ndx = 0; ndx < (int)indices.size(); ndx++)
			indices[ndx] = (deUint16)ndx;
		rnd.shuffle(indices.begin(), indices.end());

		// Use indices to re-map positions.
		for (int ndx = 0; ndx < (int)indices.size(); ndx++)
			mappedPos[indices[ndx]] = m_positions[ndx];

		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_elementBuffer);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (int)(indices.size()*sizeof(deUint16)), &indices[0], GL_DYNAMIC_DRAW);

		gl.bufferData(GL_ARRAY_BUFFER, (int)(m_positions.size()*sizeof(tcu::Vec4)), &mappedPos[0], GL_DYNAMIC_DRAW);
		gl.drawElements(GL_TRIANGLES, (int)indices.size(), GL_UNSIGNED_SHORT, DE_NULL);

		glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, testImg.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		tcu::clear(refImg.getAccess(), clearColor);
		renderReference(refImg.getAccess(), (int)indices.size(), &indices[0], &mappedPos[0], &m_colors[0]);
	}
	else
		DE_ASSERT(false);

	if (!tcu::fuzzyCompare(m_testCtx.getLog(), "Result", "Image comparison result", refImg, testImg, threshold, tcu::COMPARE_LOG_RESULT))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	m_iterNdx += 1;
	return (m_iterNdx < 3) ? CONTINUE : STOP;
}